

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.hpp
# Opt level: O3

string * __thiscall
KokkosTools::demangleNameKokkos_abi_cxx11_
          (string *__return_storage_ptr__,KokkosTools *this,string_view mangled_name)

{
  void *pvVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  long *plVar4;
  undefined8 uVar5;
  void *__s_00;
  string *ret;
  KokkosTools *pKVar6;
  KokkosTools *pKVar7;
  size_type __n;
  int status_1;
  int status;
  undefined8 local_a0;
  long local_90 [2];
  undefined8 local_80;
  long local_70 [2];
  long local_60;
  long *local_58;
  long local_50;
  long local_48 [2];
  undefined4 local_34;
  
  __s_00 = (void *)mangled_name._M_len;
  if (this != (KokkosTools *)0x0) {
    pvVar1 = memchr(__s_00,0x2f,(size_t)this);
    pKVar6 = (KokkosTools *)(-(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)__s_00);
    if (pKVar6 + -1 < (KokkosTools *)0xfffffffffffffffe) {
      pKVar7 = pKVar6;
      if (this < pKVar6) {
        pKVar7 = this;
      }
      local_58 = local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,__s_00,pKVar7 + (long)__s_00);
      plVar4 = local_58;
      local_60 = local_50;
      local_80 = (long *)((ulong)local_80._4_4_ << 0x20);
      pcVar2 = (char *)__cxa_demangle(local_58,0,0);
      local_a0 = local_90;
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,plVar4,local_60 + (long)plVar4);
      }
      else {
        sVar3 = strlen(pcVar2);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,pcVar2,pcVar2 + sVar3);
        free(pcVar2);
      }
      pcVar2 = (char *)std::__cxx11::string::append((char *)&local_a0);
      pKVar7 = pKVar6 + 1;
      if (this <= pKVar6) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",pKVar7,this);
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        _Unwind_Resume(uVar5);
      }
      pKVar6 = this + -(long)pKVar7;
      if (this <= this + -(long)pKVar7) {
        pKVar6 = this;
      }
      pKVar7 = (KokkosTools *)((long)__s_00 + (long)pKVar7);
      local_34 = 0;
      __s = (char *)__cxa_demangle(pKVar7,0,0);
      local_80 = local_70;
      if (__s == (char *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,pKVar7,pKVar6 + (long)pKVar7);
      }
      else {
        sVar3 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,__s,__s + sVar3);
        free(__s);
      }
      plVar4 = (long *)std::__cxx11::string::_M_append(pcVar2,(ulong)local_80);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*plVar4,plVar4[1] + *plVar4);
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      if (local_58 == local_48) {
        return __return_storage_ptr__;
      }
      operator_delete(local_58,local_48[0] + 1);
      return __return_storage_ptr__;
    }
  }
  local_a0 = (long *)((ulong)local_a0._4_4_ << 0x20);
  pcVar2 = (char *)__cxa_demangle(__s_00,0,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s_00,this + (long)__s_00);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
    free(pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string demangleNameKokkos(const std::string_view mangled_name) {
  if (size_t pos = mangled_name.find('/', 0);
      pos != std::string_view::npos && pos > 0) {
    /// An explicit copy of the first part of the string is needed, because
    /// @c abi::__cxa_demangle will parse the pointer until its NULL-terminated.
    return demangleName(std::string(mangled_name.substr(0, pos)))
        .append("/")
        .append(
            demangleName(mangled_name.substr(pos + 1, mangled_name.size())));
  } else {
    return demangleName(mangled_name);
  }
}